

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ** __thiscall
google::protobuf::(anonymous_namespace)::
FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
::AllocateArray<std::__cxx11::string_const*>
          (FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           *this,int array_size)

{
  long lVar1;
  int v1;
  Nullable<const_char_*> failure_msg;
  int iVar2;
  LogMessageFatal local_20;
  
  lVar1 = *(long *)this;
  if (lVar1 == 0) {
    failure_msg = "has_allocated()";
    iVar2 = 0x1b0;
  }
  else {
    iVar2 = *(int *)(this + 0xa8);
    v1 = iVar2 + array_size * 8;
    *(int *)(this + 0xa8) = v1;
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (v1,*(int *)(this + 0x70),"used <= total_.template Get<TypeToUse>()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar1 + iVar2);
    }
    iVar2 = 0x1b6;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,iVar2,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

U* AllocateArray(int array_size) {
    constexpr bool trivial = std::is_trivially_destructible<U>::value;
    using TypeToUse = typename std::conditional<trivial, char, U>::type;

    // We can only allocate after FinalizePlanning has been called.
    ABSL_CHECK(has_allocated());

    TypeToUse*& data = pointers_.template Get<TypeToUse>();
    int& used = used_.template Get<TypeToUse>();
    U* res = reinterpret_cast<U*>(data + used);
    used += trivial ? RoundUpTo<8>(array_size * sizeof(U)) : array_size;
    ABSL_CHECK_LE(used, total_.template Get<TypeToUse>());
    return res;
  }